

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9MultiProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  Bmc_MulPar_t Pars;
  Vec_Int_t *vStatuses;
  
  Pars.TimeOutGlo = 0;
  Pars.TimeOutLoc = 0;
  Pars.TimeOutInc = 0;
  Pars.TimeOutGap = 0;
  Pars.TimePerOut = 0;
  local_74 = 0;
  Extra_UtilGetoptReset();
  local_7c = 100;
  local_84 = 2;
  local_8c = 0x1e;
  local_78 = 0;
  local_70 = 0;
  local_6c = 0;
  local_88 = 0;
  local_80 = 0;
LAB_0021903a:
  iVar1 = Extra_UtilGetopt(argc,argv,"TLMGHsdvwh");
  iVar3 = globalUtilOptind;
  switch(iVar1) {
  case 0x47:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-G\" should be followed by an integer.\n";
LAB_0021925d:
      Abc_Print(-1,pcVar4);
      goto switchD_0021908a_caseD_49;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_88 = uVar2;
    break;
  case 0x48:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-H\" should be followed by an integer.\n";
      goto LAB_0021925d;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_80 = uVar2;
    break;
  case 0x49:
  case 0x4a:
  case 0x4b:
    goto switchD_0021908a_caseD_49;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
      goto LAB_0021925d;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_84 = uVar2;
    break;
  case 0x4d:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-M\" should be followed by an integer.\n";
      goto LAB_0021925d;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_7c = uVar2;
    break;
  default:
    if (iVar1 == 0x54) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0021925d;
      }
      local_8c = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if ((int)local_8c < 0) {
switchD_0021908a_caseD_49:
        iVar3 = -2;
        Abc_Print(-2,"usage: &mprove [-TLMGH num] [-sdvwh]\n");
        Abc_Print(-2,"\t         proves multi-output testcase by applying several engines\n");
        Abc_Print(-2,"\t-T num : approximate global runtime limit in seconds [default = %d]\n",
                  (ulong)local_8c);
        Abc_Print(-2,"\t-L num : approximate local runtime limit in seconds [default = %d]\n",
                  (ulong)local_84);
        Abc_Print(-2,"\t-M num : percentage of local runtime limit increase [default = %d]\n",
                  (ulong)local_7c);
        Abc_Print(-2,"\t-G num : approximate gap runtime limit in seconds [default = %d]\n",
                  (ulong)local_88);
        Abc_Print(-2,"\t-H num : timeout per output in miliseconds [default = %d]\n",(ulong)local_80
                 );
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (local_74 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-s     : toggle using combinational synthesis [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_78 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-d     : toggle dumping invariant into a file [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_70 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
        if (local_6c == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-w     : toggle printing additional verbose information [default = %s]\n",
                  pcVar5);
        pcVar4 = "\t-h     : print the command usage\n";
LAB_00219375:
        Abc_Print(iVar3,pcVar4);
        return 1;
      }
    }
    else if (iVar1 == 100) {
      local_78 = local_78 ^ 1;
    }
    else if (iVar1 == 0x73) {
      local_74 = local_74 ^ 1;
    }
    else if (iVar1 == 0x76) {
      local_70 = local_70 ^ 1;
    }
    else {
      if (iVar1 != 0x77) {
        if (iVar1 == -1) {
          Pars.fVeryVerbose = local_6c;
          Pars.fVerbose = local_70;
          Pars.fDumpFinal = local_78;
          Pars.fUseSyn = local_74;
          Pars.TimePerOut = local_80;
          Pars.TimeOutGap = local_88;
          Pars.TimeOutInc = local_7c;
          Pars.TimeOutLoc = local_84;
          Pars.TimeOutGlo = local_8c;
          p = pAbc->pGia;
          if (p == (Gia_Man_t *)0x0) {
            pcVar4 = "Abc_CommandAbc9MultiProve(): There is no AIG.\n";
          }
          else {
            if (p->nRegs != 0) {
              iVar3 = Gia_ManMultiProve(p,&Pars);
              pAbc->Status = iVar3;
              vStatuses = Abc_FrameDeriveStatusArray(pAbc->pGia->vSeqModelVec);
              Abc_FrameReplacePoStatuses(pAbc,&vStatuses);
              Abc_FrameReplaceCexVec(pAbc,&pAbc->pGia->vSeqModelVec);
              return 0;
            }
            pcVar4 = "Abc_CommandAbc9MultiProve(): The problem is combinational.\n";
          }
          iVar3 = -1;
          goto LAB_00219375;
        }
        goto switchD_0021908a_caseD_49;
      }
      local_6c = local_6c ^ 1;
    }
    goto LAB_0021903a;
  }
  globalUtilOptind = iVar3 + 1;
  if ((int)uVar2 < 1) goto switchD_0021908a_caseD_49;
  goto LAB_0021903a;
}

Assistant:

int Abc_CommandAbc9MultiProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Gia_ManMultiProve( Gia_Man_t * p, Bmc_MulPar_t * pPars );
    Vec_Int_t * vStatuses; int c;
    Bmc_MulPar_t Pars, * pPars = &Pars;
    memset( pPars, 0, sizeof(Bmc_MulPar_t) );
    pPars->TimeOutGlo =  30;
    pPars->TimeOutLoc =   2;
    pPars->TimeOutInc = 100;
    pPars->TimeOutGap =   0;
    pPars->TimePerOut =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TLMGHsdvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutGlo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutGlo < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutLoc = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutLoc <= 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutInc = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutInc <= 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutGap <= 0 )
                goto usage;
            break;
        case 'H':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-H\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimePerOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimePerOut <= 0 )
                goto usage;
            break;
        case 's':
            pPars->fUseSyn ^= 1;
            break;
        case 'd':
            pPars->fDumpFinal ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MultiProve(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9MultiProve(): The problem is combinational.\n" );
        return 1;
    }
    pAbc->Status = Gia_ManMultiProve( pAbc->pGia, pPars );
    vStatuses = Abc_FrameDeriveStatusArray( pAbc->pGia->vSeqModelVec );
    Abc_FrameReplacePoStatuses( pAbc, &vStatuses );        
    Abc_FrameReplaceCexVec( pAbc, &pAbc->pGia->vSeqModelVec );
    return 0;

usage:
    Abc_Print( -2, "usage: &mprove [-TLMGH num] [-sdvwh]\n" );
    Abc_Print( -2, "\t         proves multi-output testcase by applying several engines\n" );
    Abc_Print( -2, "\t-T num : approximate global runtime limit in seconds [default = %d]\n",     pPars->TimeOutGlo );
    Abc_Print( -2, "\t-L num : approximate local runtime limit in seconds [default = %d]\n",      pPars->TimeOutLoc );
    Abc_Print( -2, "\t-M num : percentage of local runtime limit increase [default = %d]\n",      pPars->TimeOutInc );
    Abc_Print( -2, "\t-G num : approximate gap runtime limit in seconds [default = %d]\n",        pPars->TimeOutGap );
    Abc_Print( -2, "\t-H num : timeout per output in miliseconds [default = %d]\n",               pPars->TimePerOut );
    Abc_Print( -2, "\t-s     : toggle using combinational synthesis [default = %s]\n",            pPars->fUseSyn?      "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dumping invariant into a file [default = %s]\n",            pPars->fDumpFinal?   "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",             pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing additional verbose information [default = %s]\n",  pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}